

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O0

Proxy ApplicativeHelper::getProxy(TermList t)

{
  bool bVar1;
  Term *this;
  Symbol *this_00;
  Signature *in_RDI;
  undefined8 uVar2;
  undefined4 local_4;
  uint n;
  
  bVar1 = Kernel::TermList::isVar((TermList *)in_RDI);
  if (bVar1) {
    local_4 = NOT_PROXY;
  }
  else {
    uVar2 = DAT_01333830;
    this = Kernel::TermList::term((TermList *)0x8415fc);
    n = (uint)((ulong)uVar2 >> 0x20);
    Kernel::Term::functor(this);
    this_00 = Kernel::Signature::getFunction(in_RDI,n);
    local_4 = Kernel::Signature::Symbol::proxy(this_00);
  }
  return local_4;
}

Assistant:

Signature::Proxy ApplicativeHelper::getProxy(const TermList t)
{
  if(t.isVar()){
    return Signature::NOT_PROXY;
  }
  return env.signature->getFunction(t.term()->functor())->proxy();
}